

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::CodePointMatcherWarehouse
          (CodePointMatcherWarehouse *this,CodePointMatcherWarehouse *src)

{
  CodePointMatcher **__src;
  CodePointMatcher **__dest;
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(undefined ***)((long)((this->codePoints)._M_elems + -1) + lVar1) =
         &PTR__NumberParseMatcher_003dad80;
    *(undefined4 *)((long)(this->codePoints)._M_elems + lVar1 + -8) =
         *(undefined4 *)((long)(src->codePoints)._M_elems + lVar1 + -8);
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x60);
  (this->codePointsOverflow).ptr = (src->codePointsOverflow).ptr;
  (this->codePointsOverflow).capacity = (src->codePointsOverflow).capacity;
  (this->codePointsOverflow).needToRelease = (src->codePointsOverflow).needToRelease;
  __src = (src->codePointsOverflow).stackArray;
  if ((src->codePointsOverflow).ptr == __src) {
    __dest = (this->codePointsOverflow).stackArray;
    (this->codePointsOverflow).ptr = __dest;
    memcpy(__dest,__src,(long)(src->codePointsOverflow).capacity << 3);
  }
  else {
    (src->codePointsOverflow).ptr = __src;
    (src->codePointsOverflow).capacity = 3;
    (src->codePointsOverflow).needToRelease = '\0';
  }
  this->codePointCount = src->codePointCount;
  this->codePointNumBatches = src->codePointNumBatches;
  return;
}

Assistant:

CodePointMatcherWarehouse::CodePointMatcherWarehouse(CodePointMatcherWarehouse&& src) U_NOEXCEPT
        : codePoints(std::move(src.codePoints)),
          codePointsOverflow(std::move(src.codePointsOverflow)),
          codePointCount(src.codePointCount),
          codePointNumBatches(src.codePointNumBatches) {}